

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O3

Gia_Man_t * Gia_ManUnrollInit(Gia_Man_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  int iVar7;
  int *piVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar21;
  long lVar22;
  Gia_Obj_t *pGVar23;
  uint uVar20;
  
  uVar18 = (long)nFrames * (long)p->nObjs;
  iVar7 = (int)uVar18;
  if ((p->vCopies).nCap < iVar7) {
    piVar8 = (p->vCopies).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc(uVar18 * 4);
    }
    else {
      piVar8 = (int *)realloc(piVar8,uVar18 * 4);
    }
    (p->vCopies).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = iVar7;
  }
  if (0 < iVar7) {
    memset((p->vCopies).pArray,0xff,(uVar18 & 0xffffffff) << 2);
  }
  (p->vCopies).nSize = iVar7;
  p_00 = Gia_ManStart(p->nObjs * nFrames);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pName = pcVar10;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pSpec = pcVar10;
  Gia_ManHashAlloc(p_00);
  iVar7 = p->nRegs;
  if (0 < iVar7) {
    pVVar11 = p->vCis;
    iVar13 = 0;
    do {
      iVar17 = pVVar11->nSize;
      uVar15 = (iVar17 - iVar7) + iVar13;
      if (((int)uVar15 < 0) || (iVar17 <= (int)uVar15)) {
LAB_00690eb3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar11->pArray[uVar15];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_00690ed2:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->vCopies).nSize <= iVar7) goto LAB_00690ef1;
      (p->vCopies).pArray[iVar7] = 0;
      iVar13 = iVar13 + 1;
      iVar7 = p->nRegs;
    } while (iVar13 < iVar7);
  }
  if (nFrames < 1) {
LAB_00690e99:
    Gia_ManHashStop(p_00);
    return p_00;
  }
  iVar7 = p->nObjs;
  if (0 < iVar7) {
    iVar13 = 0;
    do {
      uVar15 = iVar7 * iVar13;
      if (((int)uVar15 < 0) || ((p->vCopies).nSize <= (int)uVar15)) {
LAB_00690ef1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar8 = (p->vCopies).pArray;
      piVar8[uVar15] = 0;
      pVVar11 = p->vCis;
      uVar18 = (ulong)(uint)pVVar11->nSize;
      if (p->nRegs < pVVar11->nSize) {
        lVar14 = 0;
        do {
          if ((int)uVar18 <= lVar14) goto LAB_00690eb3;
          iVar7 = pVVar11->pArray[lVar14];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00690ed2;
          pGVar23 = p->pObjs;
          if (pGVar23 == (Gia_Obj_t *)0x0) break;
          pGVar12 = Gia_ManAppendObj(p_00);
          uVar18 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 = uVar18 | 0x9fffffff;
          *(ulong *)pGVar12 =
               uVar18 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar12 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar12)) goto LAB_00690e7a;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar12 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar12)) goto LAB_00690e7a;
          pGVar23 = pGVar23 + iVar7;
          pGVar5 = p->pObjs;
          if ((pGVar23 < pGVar5) || (pGVar5 + p->nObjs <= pGVar23)) goto LAB_00690e7a;
          uVar15 = (int)((ulong)((long)pGVar23 - (long)pGVar5) >> 2) * -0x55555555 +
                   p->nObjs * iVar13;
          if (((int)uVar15 < 0) || ((p->vCopies).nSize <= (int)uVar15)) goto LAB_00690ef1;
          piVar8 = (p->vCopies).pArray;
          piVar8[uVar15] = (int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * 0x55555556;
          lVar14 = lVar14 + 1;
          pVVar11 = p->vCis;
          uVar18 = (ulong)pVVar11->nSize;
        } while (lVar14 < (long)(uVar18 - (long)p->nRegs));
      }
      uVar15 = p->nObjs;
      if (0 < (int)uVar15) {
        lVar22 = 0;
        lVar14 = 0;
        pGVar23 = p->pObjs;
        do {
          if (pGVar23 == (Gia_Obj_t *)0x0) break;
          pGVar4 = (Gia_Obj_t *)((long)&pGVar23->field_0x0 + lVar22);
          uVar18 = *(ulong *)pGVar4;
          pGVar12 = pGVar23;
          if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar18) {
            iVar7 = (int)(uVar18 & 0x1fffffff);
            pGVar12 = (Gia_Obj_t *)(lVar22 + (ulong)(uint)(iVar7 * 4) * -3 + (long)pGVar23);
            if ((pGVar12 < pGVar23) || (pGVar23 + uVar15 <= pGVar12)) goto LAB_00690e7a;
            uVar16 = (int)(lVar22 + (ulong)(uint)(iVar7 << 2) * -3 >> 2) * -0x55555555 +
                     uVar15 * iVar13;
            if (((int)uVar16 < 0) || (uVar21 = (p->vCopies).nSize, (int)uVar21 <= (int)uVar16))
            goto LAB_00690eb3;
            if (piVar8[uVar16] < 0) goto LAB_00690f10;
            uVar20 = (uint)(uVar18 >> 0x20);
            uVar19 = uVar20 & 0x1fffffff;
            pGVar12 = (Gia_Obj_t *)(lVar22 + (ulong)(uVar19 * 4) * -3 + (long)pGVar23);
            if ((pGVar12 < pGVar23) || (pGVar23 + uVar15 <= pGVar12)) goto LAB_00690e7a;
            uVar15 = uVar15 * iVar13 + (int)(lVar22 + (ulong)(uVar19 << 2) * -3 >> 2) * -0x55555555;
            if (((int)uVar15 < 0) || (uVar21 <= uVar15)) goto LAB_00690eb3;
            if (piVar8[uVar15] < 0) goto LAB_00690f10;
            iVar7 = Gia_ManHashAnd(p_00,piVar8[uVar16] ^ (uint)(uVar18 >> 0x1d) & 1,
                                   piVar8[uVar15] ^ uVar20 >> 0x1d & 1);
            pGVar12 = p->pObjs;
            if ((pGVar4 < pGVar12) || (pGVar12 + p->nObjs <= pGVar4)) goto LAB_00690e7a;
            uVar15 = (int)((ulong)((long)pGVar23 + (lVar22 - (long)pGVar12)) >> 2) * -0x55555555 +
                     p->nObjs * iVar13;
            if (((int)uVar15 < 0) || ((p->vCopies).nSize <= (int)uVar15)) goto LAB_00690ef1;
            piVar8 = (p->vCopies).pArray;
            piVar8[uVar15] = iVar7;
            uVar15 = p->nObjs;
          }
          lVar14 = lVar14 + 1;
          lVar22 = lVar22 + 0xc;
          pGVar23 = pGVar12;
        } while (lVar14 < (int)uVar15);
      }
      pVVar11 = p->vCos;
      uVar18 = (ulong)(uint)pVVar11->nSize;
      if (0 < pVVar11->nSize) {
        piVar6 = pVVar11->pArray;
        lVar14 = 0;
        do {
          iVar7 = piVar6[lVar14];
          if ((long)iVar7 < 0) goto LAB_00690ed2;
          uVar15 = p->nObjs;
          if ((int)uVar15 <= iVar7) goto LAB_00690ed2;
          pGVar23 = p->pObjs;
          if (pGVar23 == (Gia_Obj_t *)0x0) break;
          uVar16 = (uint)*(undefined8 *)(pGVar23 + iVar7);
          pGVar4 = pGVar23 + iVar7 + -(ulong)(uVar16 & 0x1fffffff);
          if ((pGVar4 < pGVar23) || (pGVar23 + uVar15 <= pGVar4)) goto LAB_00690e7a;
          uVar21 = (int)((ulong)((long)pGVar4 - (long)pGVar23) >> 2) * -0x55555555 + uVar15 * iVar13
          ;
          if (((int)uVar21 < 0) || (uVar19 = (p->vCopies).nSize, (int)uVar19 <= (int)uVar21))
          goto LAB_00690eb3;
          if (piVar8[uVar21] < 0) {
LAB_00690f10:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10f,"int Abc_LitNotCond(int, int)");
          }
          uVar15 = uVar15 * iVar13 + iVar7;
          if (((int)uVar15 < 0) || (uVar19 <= uVar15)) goto LAB_00690ef1;
          piVar8[uVar15] = piVar8[uVar21] ^ uVar16 >> 0x1d & 1;
          lVar14 = lVar14 + 1;
          uVar18 = (ulong)pVVar11->nSize;
        } while (lVar14 < (long)uVar18);
      }
      iVar7 = p->nRegs;
      if (iVar7 < (int)uVar18) {
        lVar14 = 0;
        do {
          if ((int)uVar18 <= lVar14) goto LAB_00690eb3;
          iVar17 = pVVar11->pArray[lVar14];
          if ((iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_00690ed2;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar15 = p->nObjs * iVar13 + iVar17;
          if (((int)uVar15 < 0) || ((p->vCopies).nSize <= (int)uVar15)) goto LAB_00690eb3;
          Gia_ManAppendCo(p_00,(p->vCopies).pArray[uVar15]);
          lVar14 = lVar14 + 1;
          iVar7 = p->nRegs;
          pVVar11 = p->vCos;
          uVar18 = (ulong)(uint)pVVar11->nSize;
        } while (lVar14 < pVVar11->nSize - iVar7);
      }
      if (iVar13 == nFrames + -1) goto LAB_00690e99;
      if (0 < iVar7) {
        iVar17 = 0;
        do {
          uVar15 = (pVVar11->nSize - iVar7) + iVar17;
          if (((int)uVar15 < 0) || (pVVar11->nSize <= (int)uVar15)) goto LAB_00690eb3;
          iVar1 = pVVar11->pArray[uVar15];
          if ((iVar1 < 0) || (uVar15 = p->nObjs, (int)uVar15 <= iVar1)) goto LAB_00690ed2;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar16 = (iVar2 - iVar7) + iVar17;
          if (((int)uVar16 < 0) || (iVar2 <= (int)uVar16)) goto LAB_00690eb3;
          uVar16 = p->vCis->pArray[uVar16];
          if (((int)uVar16 < 0) || (uVar15 <= uVar16)) goto LAB_00690ed2;
          uVar21 = uVar15 * iVar13 + iVar1;
          if (((int)uVar21 < 0) || (uVar19 = (p->vCopies).nSize, (int)uVar19 <= (int)uVar21))
          goto LAB_00690eb3;
          uVar16 = uVar16 + uVar15 * (iVar13 + 1);
          if (((int)uVar16 < 0) || (uVar19 <= uVar16)) goto LAB_00690ef1;
          piVar8 = (p->vCopies).pArray;
          piVar8[uVar16] = piVar8[uVar21];
          iVar17 = iVar17 + 1;
          iVar7 = p->nRegs;
        } while (iVar17 < iVar7);
      }
      iVar13 = iVar13 + 1;
      iVar7 = p->nObjs;
    } while (0 < iVar7);
  }
LAB_00690e7a:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManUnrollInit( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int f, i;
    Vec_IntFill( &p->vCopies, nFrames * Gia_ManObjNum(p), -1 );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, 0 );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
        Gia_ManForEachAnd( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManHashAnd(pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj)) );
        Gia_ManForEachCo( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ObjFanin0CopyF(p, f, pObj) );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjCopyF(p, f, pObj) );
        if ( f == nFrames - 1 )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Gia_ObjSetCopyF( p, f+1, pObjRo, Gia_ObjCopyF(p, f, pObjRi) );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}